

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::Scanner::skipComment(Scanner *this)

{
  iterator Position;
  iterator pcVar1;
  uint uVar2;
  bool bVar3;
  
  pcVar1 = this->Current;
  if (*pcVar1 == '#') {
    Position = skip_nb_char(this,pcVar1);
    if (Position != pcVar1) {
      uVar2 = this->Column;
      do {
        uVar2 = uVar2 + 1;
        this->Current = Position;
        this->Column = uVar2;
        pcVar1 = skip_nb_char(this,Position);
        bVar3 = pcVar1 != Position;
        Position = pcVar1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void Scanner::skipComment() {
  if (*Current != '#')
    return;
  while (true) {
    // This may skip more than one byte, thus Column is only incremented
    // for code points.
    StringRef::iterator I = skip_nb_char(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }
}